

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Sequence.cpp
# Opt level: O1

double __thiscall chrono::ChFunction_Sequence::Get_weight(ChFunction_Sequence *this,double x)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  p_Var2 = (_List_node_base *)0x3ff0000000000000;
  for (p_Var1 = (this->functions).
                super__List_base<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>._M_impl.
                _M_node.super__List_node_base._M_next; p_Var1 != (_List_node_base *)&this->functions
      ; p_Var1 = p_Var1->_M_next) {
    if ((double)p_Var1[3]._M_next <= x) {
      if (x < (double)p_Var1[3]._M_prev) {
        p_Var2 = p_Var1[2]._M_prev;
      }
    }
  }
  return (double)p_Var2;
}

Assistant:

double ChFunction_Sequence::Get_weight(double x) const {
    double res = 1.0;
    for (auto iter = functions.begin(); iter != functions.end(); ++iter) {
        if ((x >= iter->t_start) && (x < iter->t_end)) {
            res = iter->weight;
        }
    }
    return res;
}